

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O1

bool __thiscall mp::SolCheck::HasAnyConViols(SolCheck *this)

{
  if (((((this->viol_var_bnds_)._M_elems[0].N_ == 0) && ((this->viol_var_bnds_)._M_elems[1].N_ == 0)
       ) && ((this->viol_var_int_)._M_elems[0].N_ == 0)) &&
     (((this->viol_var_int_)._M_elems[1].N_ == 0 &&
      ((this->viol_cons_alg_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
    return (this->viol_cons_log_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
  }
  return true;
}

Assistant:

bool HasAnyConViols() const {
    return viol_var_bnds_[0].N_ || viol_var_bnds_[1].N_
           || viol_var_int_[0].N_ || viol_var_int_[1].N_
           || viol_cons_alg_.size()
           || viol_cons_log_.size();
  }